

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void setnodevector(lua_State *L,Table *t,int size)

{
  bool bVar1;
  int iVar2;
  Node *pNVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  char *fmt;
  ulong uVar8;
  long lVar9;
  
  if (size == 0) {
    pNVar3 = &dummynode_;
    t->node = &dummynode_;
    bVar5 = 0;
    lVar9 = 0;
LAB_00108299:
    t->lsizenode = bVar5;
    t->lastfree = pNVar3 + lVar9;
    return;
  }
  uVar6 = size - 1;
  iVar2 = -1;
  if (0xff < uVar6) {
    iVar2 = -1;
    uVar7 = uVar6;
    do {
      iVar2 = iVar2 + 8;
      uVar6 = uVar7 >> 8;
      bVar1 = 0xffff < uVar7;
      uVar7 = uVar6;
    } while (bVar1);
  }
  if ((int)(iVar2 + (uint)(byte)luaO_log2_log_2[uVar6]) < 0x1e) {
    bVar5 = (char)iVar2 + luaO_log2_log_2[uVar6] + 1;
    lVar9 = 0x100000000 << (bVar5 & 0x3f);
    if (-1 < lVar9 + 0x100000000) {
      pNVar3 = (Node *)luaM_realloc_(L,(void *)0x0,0,(lVar9 >> 0x1d) * 5);
      t->node = pNVar3;
      uVar6 = (uint)(1L << (bVar5 & 0x3f));
      if (0 < (int)uVar6) {
        uVar8 = (ulong)(uVar6 & 0x7fffffff);
        lVar4 = 0x20;
        do {
          pNVar3 = t->node;
          *(undefined8 *)((long)&(pNVar3->i_val).value + lVar4) = 0;
          *(undefined4 *)((long)pNVar3 + lVar4 + -8) = 0;
          *(undefined4 *)((long)pNVar3 + lVar4 + -0x18) = 0;
          lVar4 = lVar4 + 0x28;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
        pNVar3 = t->node;
      }
      lVar9 = lVar9 >> 0x20;
      goto LAB_00108299;
    }
    fmt = "memory allocation error: block too big";
  }
  else {
    fmt = "table overflow";
  }
  luaG_runerror(L,fmt);
}

Assistant:

static void setnodevector(lua_State*L,Table*t,int size){
int lsize;
if(size==0){
t->node=cast(Node*,(&dummynode_));
lsize=0;
}
else{
int i;
lsize=ceillog2(size);
if(lsize>(32-2))
luaG_runerror(L,"table overflow");
size=twoto(lsize);
t->node=luaM_newvector(L,size,Node);
for(i=0;i<size;i++){
Node*n=gnode(t,i);
gnext(n)=NULL;
setnilvalue(gkey(n));
setnilvalue(gval(n));
}
}
t->lsizenode=cast_byte(lsize);
t->lastfree=gnode(t,size);
}